

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_check_include_missing_recursive(lys_module *main_module,lys_submodule *sub)

{
  ly_ctx *ctx;
  lys_include *plVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  lys_include *plVar5;
  long lVar6;
  ulong uVar7;
  lys_submodule *sub_00;
  ulong uVar8;
  int iVar9;
  
  ctx = main_module->ctx;
  uVar8 = 0;
  iVar9 = 0;
  do {
    if (sub->inc_size <= uVar8) {
      return iVar9;
    }
    lVar6 = 0;
    uVar7 = (ulong)main_module->inc_size;
    while (uVar7 != 0) {
      if (*(lys_submodule **)(main_module->inc->rev + lVar6 + -8) == sub->inc[uVar8].submodule) {
        if ((char)uVar7 != '\0') {
          sub_00 = sub->inc[uVar8].submodule;
          goto LAB_0012677a;
        }
        break;
      }
      lVar6 = lVar6 + 0x30;
      uVar7 = uVar7 - 1;
    }
    if ((main_module->field_0x40 & 0xc) == 0) {
      ly_log(ctx,LY_LLWRN,LY_SUCCESS,
             "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\"."
             ,main_module->name,(sub->inc[uVar8].submodule)->name,sub->name);
      ly_log(ctx,LY_LLWRN,LY_SUCCESS,
             "To avoid further issues, adding submodule \"%s\" into the main module \"%s\".",
             (sub->inc[uVar8].submodule)->name,main_module->name);
    }
    else {
      ly_vlog(ctx,LYE_MISSSTMT,LY_VLOG_NONE,(void *)0x0,"include");
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\"."
              ,main_module->name,(sub->inc[uVar8].submodule)->name,sub->name);
      iVar9 = 1;
    }
    bVar2 = main_module->inc_size + 1;
    main_module->inc_size = bVar2;
    plVar5 = (lys_include *)realloc(main_module->inc,(ulong)bVar2 * 0x30);
    if (plVar5 == (lys_include *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyp_check_include_missing_recursive");
      return 1;
    }
    main_module->inc = plVar5;
    uVar7 = (ulong)main_module->inc_size;
    plVar5[uVar7 - 1].dsc = (char *)0x0;
    (&plVar5[uVar7 - 1].dsc)[1] = (char *)0x0;
    *(undefined8 *)(plVar5[uVar7 - 1].rev + 8) = 0;
    *(lys_ext_instance ***)(plVar5[uVar7 - 1].rev + 8 + 8) = (lys_ext_instance **)0x0;
    plVar1 = plVar5 + (uVar7 - 1);
    plVar1->submodule = (lys_submodule *)0x0;
    plVar1->rev[0] = '\0';
    plVar1->rev[1] = '\0';
    plVar1->rev[2] = '\0';
    plVar1->rev[3] = '\0';
    plVar1->rev[4] = '\0';
    plVar1->rev[5] = '\0';
    plVar1->rev[6] = '\0';
    plVar1->rev[7] = '\0';
    plVar1 = sub->inc;
    *(undefined2 *)(plVar5[uVar7 - 1].rev + 8) = *(undefined2 *)(plVar1[uVar8].rev + 8);
    *(undefined8 *)plVar5[uVar7 - 1].rev = *(undefined8 *)plVar1[uVar8].rev;
    sub_00 = plVar1[uVar8].submodule;
    plVar5[uVar7 - 1].submodule = sub_00;
LAB_0012677a:
    iVar3 = lyp_check_include_missing_recursive(main_module,sub_00);
    iVar4 = iVar9;
    if (iVar3 != 0) {
      iVar4 = 1;
    }
    if (iVar9 == 0) {
      iVar9 = iVar4;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static int
lyp_check_include_missing_recursive(struct lys_module *main_module, struct lys_submodule *sub)
{
    uint8_t i, j;
    void *reallocated;
    int ret = 0, tmp;
    struct ly_ctx *ctx = main_module->ctx;

    for (i = 0; i < sub->inc_size; i++) {
        /* check that the include is also present in the main module */
        for (j = 0; j < main_module->inc_size; j++) {
            if (main_module->inc[j].submodule == sub->inc[i].submodule) {
                break;
            }
        }

        if (j == main_module->inc_size) {
            /* match not found */
            if (main_module->version >= LYS_VERSION_1_1) {
                LOGVAL(ctx, LYE_MISSSTMT, LY_VLOG_NONE, NULL, "include");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL,
                       "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\".",
                       main_module->name, sub->inc[i].submodule->name, sub->name);
                /* now we should return error, but due to the issues with freeing the module, we actually have
                 * to go through the all includes and, as in case of 1.0, add them into the main module and fail
                 * at the end when all the includes are in the main module and we can free them */
                ret = 1;
            } else {
                /* not strictly an error in YANG 1.0 */
                LOGWRN(ctx, "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\".",
                       main_module->name, sub->inc[i].submodule->name, sub->name);
                LOGWRN(ctx, "To avoid further issues, adding submodule \"%s\" into the main module \"%s\".",
                       sub->inc[i].submodule->name, main_module->name);
                /* but since it is a good practise and because we expect all the includes in the main module
                 * when searching it and also when freeing the module, put it into it */
            }
            main_module->inc_size++;
            reallocated = realloc(main_module->inc, main_module->inc_size * sizeof *main_module->inc);
            LY_CHECK_ERR_RETURN(!reallocated, LOGMEM(ctx), 1);
            main_module->inc = reallocated;
            memset(&main_module->inc[main_module->inc_size - 1], 0, sizeof *main_module->inc);
            /* to avoid unexpected consequences, copy just a link to the submodule and the revision,
             * all other substatements of the include are ignored */
            memcpy(&main_module->inc[main_module->inc_size - 1].rev, sub->inc[i].rev, LY_REV_SIZE - 1);
            main_module->inc[main_module->inc_size - 1].submodule = sub->inc[i].submodule;
        }

        /* recursion */
        tmp = lyp_check_include_missing_recursive(main_module, sub->inc[i].submodule);
        if (!ret && tmp) {
            ret = 1;
        }
    }

    return ret;
}